

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

IndexTensor *
dynet::TensorTools::categorical_sample_log_prob_dev<dynet::Device_CPU>
          (IndexTensor *__return_storage_ptr__,Device_CPU *dev,Tensor *v,uint dim,uint num)

{
  DeviceMempool DVar1;
  Device *pDVar2;
  AlignedMemoryPool *this;
  float *pfVar3;
  runtime_error *this_00;
  invalid_argument *this_01;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  DefaultDevice *device;
  uint uVar8;
  uint uVar9;
  array<Index,_1> in_dims;
  _Type alVar10;
  Dim ids_dim;
  ostringstream oss;
  Tensor local_258;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  uint local_1f8;
  AlignedMemoryPool *local_1e8;
  type local_1e0;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>_>
  local_1b8;
  type local_1a8 [2];
  
  if (1 < num) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Currently do not support num > 1 in categorical_sample_log_prob",0x3f);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,(string *)&local_258);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  DVar1 = v->mem_pool;
  if (DVar1 == NONE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Input Tensor to TensorTools::argmax must be associated with a memory pool.",0x4a);
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_01,(string *)&local_258);
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1f8 = (v->d).bd;
  local_208 = *(undefined8 *)((v->d).d + 4);
  uStack_200 = *(ulong *)((v->d).d + 6);
  local_218 = *(undefined8 *)(v->d).d;
  uStack_210 = *(undefined8 *)((v->d).d + 2);
  alVar10[0]._4_4_ = 0;
  alVar10[0]._0_4_ = dim;
  *(uint *)((long)&local_218 + alVar10[0] * 4) = num;
  pDVar2 = v->device;
  (__return_storage_ptr__->d).bd = local_1f8;
  *(undefined8 *)((__return_storage_ptr__->d).d + 4) = local_208;
  *(ulong *)((__return_storage_ptr__->d).d + 6) = uStack_200;
  *(undefined8 *)(__return_storage_ptr__->d).d = local_218;
  *(undefined8 *)((__return_storage_ptr__->d).d + 2) = uStack_210;
  __return_storage_ptr__->device = pDVar2;
  __return_storage_ptr__->mem_pool = DVar1;
  this = (pDVar2->pools).
         super__Vector_base<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>
         ._M_impl.super__Vector_impl_data._M_start[3];
  iVar6 = 1;
  iVar7 = 1;
  if (uStack_200 >> 0x20 != 0) {
    iVar7 = 1;
    uVar4 = 0;
    do {
      iVar7 = iVar7 * *(int *)((long)&local_218 + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uStack_200 >> 0x20 != uVar4);
  }
  local_1e0.m_data =
       (StoragePointerType)AlignedMemoryPool::allocate(this,(ulong)(iVar7 * local_1f8) << 3);
  __return_storage_ptr__->v = local_1e0.m_data;
  local_258.d.bd = (v->d).bd;
  local_258.d.d._0_8_ = *(undefined8 *)(v->d).d;
  local_258.d.d._8_8_ = *(undefined8 *)((v->d).d + 2);
  local_258.d.d._16_8_ = *(undefined8 *)((v->d).d + 4);
  local_258.d._24_8_ = *(undefined8 *)((v->d).d + 6);
  local_258.device = v->device;
  local_258.mem_pool = v->mem_pool;
  uVar4 = (ulong)(v->d).nd;
  if (uVar4 != 0) {
    iVar6 = 1;
    uVar5 = 0;
    do {
      iVar6 = iVar6 * (v->d).d[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  pfVar3 = (float *)AlignedMemoryPool::allocate(this,(ulong)(iVar6 * (v->d).bd) << 2);
  local_258.v = pfVar3;
  randomize_uniform(&local_258,0.0,1.0);
  uVar9 = (v->d).nd;
  if (uVar9 == 2) {
    uVar8 = (v->d).d[0];
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
         (long)(int)(v->d).d[1];
LAB_0041ad09:
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = 1;
LAB_0041ad0e:
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1;
  }
  else {
    if (uVar9 == 3) {
      uVar8 = (v->d).d[0];
      local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
           (long)(int)(v->d).d[1];
      local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[2] =
           (long)(int)(v->d).d[2];
      goto LAB_0041ad0e;
    }
    if (uVar9 != 4) {
      uVar8 = 1;
      if (uVar9 != 0) {
        uVar8 = (v->d).d[0];
      }
      local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = 1;
      goto LAB_0041ad09;
    }
    uVar8 = (v->d).d[0];
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
         (long)(int)(v->d).d[1];
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[2] =
         (long)(int)(v->d).d[2];
    local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[3] =
         (long)(int)(v->d).d[3];
  }
  local_1a8[0].m_xpr.m_lhs_xpr.m_data = v->v;
  local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[4] = (long)(int)(v->d).bd;
  local_1a8[0].m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_5>._M_elems[0] = (long)(int)uVar8;
  uVar9 = local_258.d.d[0];
  if (local_258.d.nd == 2) {
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
         (long)(int)local_258.d.d[1];
LAB_0041ad9d:
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = 1
    ;
LAB_0041ada3:
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1
    ;
  }
  else {
    if (local_258.d.nd == 3) {
      local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
           (long)(int)local_258.d.d[1];
      local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] =
           (long)(int)local_258.d.d[2];
      goto LAB_0041ada3;
    }
    if (local_258.d.nd != 4) {
      uVar9 = 1;
      if (local_258.d.nd != 0) {
        uVar9 = local_258.d.d[0];
      }
      local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
           1;
      goto LAB_0041ad9d;
    }
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] =
         (long)(int)local_258.d.d[1];
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] =
         (long)(int)local_258.d.d[2];
    local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] =
         (long)(int)local_258.d.d[3];
  }
  local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[0] =
       (long)(int)uVar9;
  local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_5>._M_elems[4] =
       (long)(int)local_258.d.bd;
  uVar9 = (__return_storage_ptr__->d).nd;
  if (uVar9 == 2) {
    uVar8 = (__return_storage_ptr__->d).d[0];
    local_1e0.m_dimensions.super_array<long,_4>._M_elems[1] =
         (long)(int)(__return_storage_ptr__->d).d[1];
    uVar9 = (__return_storage_ptr__->d).bd;
  }
  else {
    if (uVar9 == 3) {
      uVar8 = (__return_storage_ptr__->d).d[0];
      local_1e0.m_dimensions.super_array<long,_4>._M_elems[1] =
           (long)(int)(__return_storage_ptr__->d).d[1];
      local_1e0.m_dimensions.super_array<long,_4>._M_elems[2] =
           (long)(int)(__return_storage_ptr__->d).d[2];
      uVar9 = (__return_storage_ptr__->d).bd;
      goto LAB_0041aea2;
    }
    uVar8 = 1;
    if (uVar9 != 0) {
      uVar8 = (__return_storage_ptr__->d).d[0];
    }
    uVar9 = (__return_storage_ptr__->d).bd;
    local_1e0.m_dimensions.super_array<long,_4>._M_elems[1] = 1;
  }
  local_1e0.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
LAB_0041aea2:
  local_1e0.m_dimensions.super_array<long,_4>._M_elems[0] = (long)(int)uVar8;
  local_1e0.m_dimensions.super_array<long,_4>._M_elems[3] = (long)(int)uVar9;
  local_1b8.m_lhs_xpr = &local_1e0;
  device = dev->edevice;
  local_1b8.m_rhs_xpr = local_1a8;
  local_1e8 = this;
  local_1a8[0].m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_data = pfVar3;
  local_1a8[0].m_return_dim = alVar10[0];
  local_1a8[0].m_reduce_dims._M_elems[0] = (_Type)(_Type)alVar10[0];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>_>,_Eigen::DefaultDevice,_false,_(Eigen::internal::TiledEvaluation)0>
  ::run(&local_1b8,device);
  AlignedMemoryPool::free(local_1e8,device);
  return __return_storage_ptr__;
}

Assistant:

IndexTensor TensorTools::categorical_sample_log_prob_dev(const MyDevice & dev, const Tensor& v, unsigned dim, unsigned num) {
  if(num > 1)
    DYNET_RUNTIME_ERR("Currently do not support num > 1 in categorical_sample_log_prob");
  DYNET_ARG_CHECK(v.mem_pool != DeviceMempool::NONE, "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  Dim ids_dim = v.d; ids_dim.d[dim] = num;
  IndexTensor ids(ids_dim, nullptr, v.device, v.mem_pool);
  AlignedMemoryPool* scratch_allocator = v.device->pools[(int)DeviceMempool::SCS];
  ids.v = static_cast<Eigen::DenseIndex*>(scratch_allocator->allocate(ids_dim.size() * sizeof(Eigen::DenseIndex)));
  Dim copy_dim = v.d; // TODO: make this match num to enable num
  Tensor copy(copy_dim, nullptr, v.device, v.mem_pool);
  copy.v = static_cast<float*>(scratch_allocator->allocate(v.d.size() * sizeof(float)));
  TensorTools::randomize_uniform(copy);
  ids.tb<3>().device(*dev.edevice) = (v.tb<4>() - (-copy.tb<4>().log()).log()).argmax(dim);
  scratch_allocator->free();
  return ids;
}